

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O0

undefined8 Gyroid(void)

{
  vec3 p1;
  vec3 p2;
  undefined8 in_RDI;
  vec<double,_3> local_b8;
  double local_90;
  vec<double,_3> local_88;
  Box local_70;
  GyroidSDF local_39;
  function<double_(linalg::vec<double,_3>)> local_38;
  double local_18;
  double period;
  
  local_18 = 6.283185307179586;
  std::function<double(linalg::vec<double,3>)>::function<GyroidSDF,void>
            ((function<double(linalg::vec<double,3>)> *)&local_38,&local_39);
  local_90 = 0.0;
  linalg::vec<double,_3>::vec(&local_88,&local_90);
  linalg::vec<double,_3>::vec(&local_b8,&local_18);
  p1.y = local_88.y;
  p1.x = local_88.x;
  p1.z = local_88.z;
  p2.y = local_b8.y;
  p2.x = local_b8.x;
  p2.z = local_b8.z;
  manifold::Box::Box(&local_70,p1,p2);
  manifold::Manifold::LevelSet(0,0,0,in_RDI,&local_38,1);
  std::function<double_(linalg::vec<double,_3>)>::~function(&local_38);
  return in_RDI;
}

Assistant:

Manifold Gyroid() {
  const double period = kTwoPi;
  return Manifold::LevelSet(GyroidSDF(), {vec3(0.0), vec3(period)}, 0.5);
}